

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

float deqp::gles3::Functional::computeFloatingPointError(float value,int numAccurateBits)

{
  float fVar1;
  byte bVar2;
  float fVar3;
  
  bVar2 = 0x17 - (char)numAccurateBits;
  fVar3 = (float)((uint)value & 0x7f800000);
  fVar1 = 1.1754944e-38;
  if (((uint)value & 0x7fffff) == 0) {
    fVar1 = fVar3;
  }
  if (fVar3 != 0.0) {
    fVar1 = fVar3;
  }
  return (float)(((0x7fffffU >> (bVar2 & 0x1f)) << (bVar2 & 0x1f) | (uint)fVar1) ^ 0x7fffff) - fVar1
  ;
}

Assistant:

float computeFloatingPointError (const float value, const int numAccurateBits)
{
	const int		numGarbageBits	= 23-numAccurateBits;
	const deUint32	mask			= (1u<<numGarbageBits)-1u;
	const int		exp				= tcu::Float32(value).exponent();

	return tcu::Float32::construct(+1, exp, (1u<<23) | mask).asFloat() - tcu::Float32::construct(+1, exp, 1u<<23).asFloat();
}